

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

TestBuilder * __thiscall anon_unknown.dwarf_af3cfc::TestBuilder::PushWitRedeem(TestBuilder *this)

{
  long lVar1;
  TestBuilder *pTVar2;
  TestBuilder *in_RDI;
  long in_FS_OFFSET;
  TestBuilder *in_stack_ffffffffffffff88;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff90;
  allocator_type *in_stack_ffffffffffffffb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  iterator __last;
  iterator in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __last.ptr = (uchar *)in_RDI;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_ffffffffffffff90);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff90);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffff88);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffd8,__last,in_stack_ffffffffffffffb0);
  DoPush(in_RDI,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffff88);
  pTVar2 = AsWit(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pTVar2;
  }
  __stack_chk_fail();
}

Assistant:

TestBuilder& PushWitRedeem()
    {
        DoPush(std::vector<unsigned char>(witscript.begin(), witscript.end()));
        return AsWit();
    }